

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O3

int Abc_NtkIsAcyclicWithBoxes_rec(Abc_Obj_t *pNode)

{
  Abc_Ntk_t *pAVar1;
  Abc_Ntk_t *pAVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  uint uVar6;
  int Fill;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar7;
  char *__format;
  FILE *__stream;
  long lVar8;
  Abc_Obj_t *pNode_00;
  
  pAVar1 = pNode->pNtk;
  iVar3 = 1;
  switch(*(uint *)&pNode->field_0x14 & 0xf) {
  case 2:
  case 8:
  case 10:
    goto switchD_001c5f52_caseD_2;
  case 6:
    __assert_fail("!Abc_ObjIsNet(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcDfs.c"
                  ,0x672,"int Abc_NtkIsAcyclicWithBoxes_rec(Abc_Obj_t *)");
  case 7:
    goto switchD_001c5f52_caseD_7;
  }
  if ((*(uint *)&pNode->field_0x14 & 0xe) != 8) {
    __assert_fail("Abc_ObjIsNode(pNode) || Abc_ObjIsBox(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcDfs.c"
                  ,0x675,"int Abc_NtkIsAcyclicWithBoxes_rec(Abc_Obj_t *)");
  }
switchD_001c5f52_caseD_7:
  iVar3 = pNode->Id;
  Vec_IntFillExtra(&pAVar1->vTravIds,iVar3 + 1,0x7ecbec);
  if ((-1 < (long)iVar3) && (iVar3 < (pAVar1->vTravIds).nSize)) {
    pAVar2 = pNode->pNtk;
    if ((pAVar1->vTravIds).pArray[iVar3] == pAVar2->nTravIds + -1) {
      __assert_fail("!Abc_NodeIsTravIdPrevious(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcDfs.c"
                    ,0x677,"int Abc_NtkIsAcyclicWithBoxes_rec(Abc_Obj_t *)");
    }
    iVar3 = pNode->Id;
    Vec_IntFillExtra(&pAVar2->vTravIds,iVar3 + 1,Fill);
    if ((-1 < (long)iVar3) && (iVar3 < (pAVar2->vTravIds).nSize)) {
      if ((pAVar2->vTravIds).pArray[iVar3] == pNode->pNtk->nTravIds) {
        fprintf(_stdout,"Network \"%s\" contains combinational loop!\n",pAVar1->pName);
        __stream = _stdout;
        if ((*(uint *)&pNode->field_0x14 & 0xe) == 8 || (*(uint *)&pNode->field_0x14 & 0xf) == 10) {
          pcVar5 = Abc_ObjName(pNode);
          __format = "Box \"%s\" is encountered twice on the following path to the COs:\n";
        }
        else {
          pcVar5 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanouts).pArray]);
          __format = "Node \"%s\" is encountered twice on the following path to the COs:\n";
        }
LAB_001c61c8:
        iVar3 = 0;
        fprintf(__stream,__format,pcVar5);
      }
      else {
        Abc_NodeSetTravIdCurrent((Abc_Obj_t *)pNode->pNtk);
        if (0 < (pNode->vFanins).nSize) {
          lVar8 = 0;
          uVar7 = extraout_RDX;
          do {
            pNode_00 = (Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar8]];
            if ((*(uint *)&pNode->field_0x14 & 0xe) == 8 ||
                (*(uint *)&pNode->field_0x14 & 0xf) == 10) {
              pNode_00 = (Abc_Obj_t *)pNode_00->pNtk->vObjs->pArray[*(pNode_00->vFanins).pArray];
            }
            if (pNode_00->pNtk->ntkType == ABC_NTK_NETLIST) {
              pNode_00 = (Abc_Obj_t *)pNode_00->pNtk->vObjs->pArray[*(pNode_00->vFanins).pArray];
            }
            uVar4 = *(uint *)&pNode_00->field_0x14;
            uVar6 = uVar4 & 0xf;
            if (uVar6 == 5) {
              pNode_00 = (Abc_Obj_t *)pNode_00->pNtk->vObjs->pArray[*(pNode_00->vFanins).pArray];
              uVar4 = *(uint *)&pNode_00->field_0x14;
              uVar6 = uVar4 & 0xf;
            }
            switch(uVar6) {
            case 2:
            case 8:
            case 10:
              goto switchD_001c6112_caseD_2;
            default:
              if ((uVar4 & 0xe) != 8) {
                __assert_fail("Abc_ObjIsNode(pFanin) || Abc_ObjIsBox(pFanin)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcDfs.c"
                              ,0x68f,"int Abc_NtkIsAcyclicWithBoxes_rec(Abc_Obj_t *)");
              }
              break;
            case 7:
              break;
            }
            pAVar1 = pNode_00->pNtk;
            iVar3 = pNode_00->Id;
            Vec_IntFillExtra(&pAVar1->vTravIds,iVar3 + 1,(int)uVar7);
            if (((long)iVar3 < 0) || ((pAVar1->vTravIds).nSize <= iVar3)) goto LAB_001c6235;
            uVar7 = extraout_RDX_00;
            if (((pAVar1->vTravIds).pArray[iVar3] != pNode_00->pNtk->nTravIds + -1) &&
               (iVar3 = Abc_NtkIsAcyclicWithBoxes_rec(pNode_00), __stream = _stdout,
               uVar7 = extraout_RDX_01, iVar3 == 0)) {
              if ((*(uint *)&pNode_00->field_0x14 & 0xf) != 10 &&
                  (*(uint *)&pNode_00->field_0x14 & 0xe) != 8) {
                pNode_00 = (Abc_Obj_t *)pNode_00->pNtk->vObjs->pArray[*(pNode_00->vFanouts).pArray];
              }
              pcVar5 = Abc_ObjName(pNode_00);
              __format = " %s ->";
              goto LAB_001c61c8;
            }
switchD_001c6112_caseD_2:
            lVar8 = lVar8 + 1;
          } while (lVar8 < (pNode->vFanins).nSize);
        }
        uVar4 = *(uint *)&pNode->field_0x14 & 0xf;
        if ((uVar4 != 7) && (uVar4 != 10 && (*(uint *)&pNode->field_0x14 & 0xe) != 8)) {
          __assert_fail("Abc_ObjIsNode(pNode) || Abc_ObjIsBox(pNode)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcDfs.c"
                        ,0x69a,"int Abc_NtkIsAcyclicWithBoxes_rec(Abc_Obj_t *)");
        }
        Abc_NodeSetTravIdPrevious((Abc_Obj_t *)pNode->pNtk);
        iVar3 = 1;
      }
switchD_001c5f52_caseD_2:
      return iVar3;
    }
  }
LAB_001c6235:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Abc_NtkIsAcyclicWithBoxes_rec( Abc_Obj_t * pNode )
{
    Abc_Ntk_t * pNtk = pNode->pNtk;
    Abc_Obj_t * pFanin;
    int fAcyclic, i;
    assert( !Abc_ObjIsNet(pNode) );
    if ( Abc_ObjIsPi(pNode) || Abc_ObjIsLatch(pNode) || Abc_ObjIsBlackbox(pNode) )
        return 1;
    assert( Abc_ObjIsNode(pNode) || Abc_ObjIsBox(pNode) );
    // make sure the node is not visited
    assert( !Abc_NodeIsTravIdPrevious(pNode) );
    // check if the node is part of the combinational loop
    if ( Abc_NodeIsTravIdCurrent(pNode) )
    {
        fprintf( stdout, "Network \"%s\" contains combinational loop!\n", Abc_NtkName(pNtk) );
        if ( Abc_ObjIsBox(pNode) )
            fprintf( stdout, "Box \"%s\" is encountered twice on the following path to the COs:\n", Abc_ObjName(pNode) );
        else
            fprintf( stdout, "Node \"%s\" is encountered twice on the following path to the COs:\n", Abc_ObjName(Abc_ObjFanout0(pNode)) );
        return 0;
    }
    // mark this node as a node on the current path
    Abc_NodeSetTravIdCurrent( pNode );
    // visit the transitive fanin
    Abc_ObjForEachFanin( pNode, pFanin, i )
    { 
        if ( Abc_ObjIsBox(pNode) )
            pFanin = Abc_ObjFanin0(pFanin);
        pFanin = Abc_ObjFanin0Ntk(pFanin);
        if ( Abc_ObjIsBo(pFanin) )
            pFanin = Abc_ObjFanin0(pFanin);
        // check if the fanin is visited
        if ( Abc_ObjIsPi(pFanin) || Abc_ObjIsLatch(pFanin) || Abc_ObjIsBlackbox(pFanin) )
            continue;
        assert( Abc_ObjIsNode(pFanin) || Abc_ObjIsBox(pFanin) );
        if ( Abc_NodeIsTravIdPrevious(pFanin) ) 
            continue;
        // traverse the fanin's cone searching for the loop
        if ( (fAcyclic = Abc_NtkIsAcyclicWithBoxes_rec(pFanin)) )
            continue;
        // return as soon as the loop is detected
        fprintf( stdout, " %s ->", Abc_ObjName( Abc_ObjIsBox(pFanin) ? pFanin : Abc_ObjFanout0(pFanin) ) );
        return 0;
    }
    // mark this node as a visited node
    assert( Abc_ObjIsNode(pNode) || Abc_ObjIsBox(pNode) );
    Abc_NodeSetTravIdPrevious( pNode );
    return 1;
}